

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_EAX;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar9;
  undefined1 auVar8 [16];
  allocator_type local_a9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined1 auStack_68 [12];
  undefined1 local_58 [12];
  int iStack_4c;
  int iStack_48;
  undefined8 uStack_44;
  size_t local_38;
  
  uVar6._0_4_ = this->output_width;
  uVar6._4_4_ = this->output_height;
  auVar8._0_4_ = -(uint)((undefined4)uVar6 == 0);
  auVar8._4_4_ = -(uint)((undefined4)uVar6 == 0);
  auVar8._8_4_ = -(uint)(uVar6._4_4_ == 0);
  auVar8._12_4_ = -(uint)(uVar6._4_4_ == 0);
  iVar5 = movmskpd(in_EAX,auVar8);
  if (iVar5 != 0) {
    uVar9 = (uint)(bottom_blob->dims == 1);
    uVar1 = bottom_blob->w;
    uVar3 = bottom_blob->h;
    uVar7 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar2 = this->width_scale;
    uVar4 = this->height_scale;
    uVar6 = CONCAT44((int)((float)uVar4 *
                          (float)(uVar9 & 0x3f800000 | ~uVar9 & (uint)(float)(int)uVar3)),
                     (int)((float)uVar2 *
                          (float)(uVar7 & 0x3f800000 | ~uVar7 & (uint)(float)(int)uVar1)));
  }
  local_38 = 0;
  local_78 = SUB1612((undefined1  [16])0x0,0);
  uStack_6c = 0;
  auStack_68 = SUB1612((undefined1  [16])0x0,4);
  local_58 = SUB1612((undefined1  [16])0x0,0);
  uStack_44._0_4_ = 0;
  uStack_44._4_4_ = 0;
  iStack_4c = (int)uVar6;
  iStack_48 = (int)((ulong)uVar6 >> 0x20);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs,2,(allocator_type *)&top_blobs);
  Mat::operator=(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start,bottom_blob);
  Mat::operator=(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,(Mat *)local_78);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&top_blobs,1,&local_a9);
  iVar5 = (*(this->super_Layer)._vptr_Layer[6])(this,&bottom_blobs,&top_blobs,opt);
  Mat::operator=(top_blob,top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&top_blobs);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs);
  Mat::~Mat((Mat *)local_78);
  return iVar5;
}

Assistant:

int Interp::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    int outw = output_width;
    int outh = output_height;
    if (bottom_blob.dims == 1)
    {
        w = 1;
        h = 1;
    }
    if (outw == 0 || outh == 0)
    {
        outw = static_cast<int>(w * width_scale);
        outh = static_cast<int>(h * height_scale);
    }

    Mat reference_blob;
    reference_blob.w = outw;
    reference_blob.h = outh;

    std::vector<Mat> bottom_blobs(2);
    bottom_blobs[0] = bottom_blob;
    bottom_blobs[1] = reference_blob;

    std::vector<Mat> top_blobs(1);

    int ret = forward(bottom_blobs, top_blobs, opt);

    top_blob = top_blobs[0];

    return ret;
}